

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O1

void helics::zeromq::loadPoller
               (vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *poller,
               vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_> *sockets,
               socket_t *brokerSocket,socket_t *brokerConnection,bool serverMode,bool hasBroker)

{
  pointer pzVar1;
  pointer ppsVar2;
  
  if (serverMode && hasBroker) {
    std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::resize(poller,2);
    std::vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>::resize(sockets,2);
    pzVar1 = (poller->super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pzVar1->socket = (brokerSocket->super_socket_base)._handle;
    pzVar1->events = 1;
    *(sockets->super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>)._M_impl.
     super__Vector_impl_data._M_start = brokerSocket;
    pzVar1 = (poller->super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pzVar1[1].socket = (brokerConnection->super_socket_base)._handle;
    pzVar1[1].events = 1;
    ppsVar2 = (sockets->super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>).
              _M_impl.super__Vector_impl_data._M_start + 1;
  }
  else {
    if (serverMode) {
      std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::resize(poller,1);
      std::vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>::resize(sockets,1);
      pzVar1 = (poller->super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pzVar1->socket = (brokerSocket->super_socket_base)._handle;
      pzVar1->events = 1;
      *(sockets->super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>)._M_impl.
       super__Vector_impl_data._M_start = brokerSocket;
    }
    if (!hasBroker) {
      return;
    }
    std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::resize(poller,1);
    std::vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>::resize(sockets,1);
    pzVar1 = (poller->super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pzVar1->socket = (brokerConnection->super_socket_base)._handle;
    pzVar1->events = 1;
    ppsVar2 = (sockets->super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
  }
  *ppsVar2 = brokerConnection;
  return;
}

Assistant:

static void loadPoller(std::vector<zmq::pollitem_t>& poller,
                       std::vector<zmq::socket_t*>& sockets,
                       zmq::socket_t& brokerSocket,
                       zmq::socket_t& brokerConnection,
                       bool serverMode,
                       bool hasBroker)
{
    if (serverMode && hasBroker) {
        poller.resize(2);
        sockets.resize(2);
        poller[0].socket = static_cast<void*>(brokerSocket);
        poller[0].events = ZMQ_POLLIN;
        sockets[0] = &brokerSocket;
        poller[1].socket = static_cast<void*>(brokerConnection);
        poller[1].events = ZMQ_POLLIN;
        sockets[1] = &brokerConnection;
    } else {
        if (serverMode) {
            poller.resize(1);
            sockets.resize(1);
            poller[0].socket = static_cast<void*>(brokerSocket);
            poller[0].events = ZMQ_POLLIN;
            sockets[0] = &brokerSocket;
        }
        if (hasBroker) {
            poller.resize(1);
            sockets.resize(1);
            poller[0].socket = static_cast<void*>(brokerConnection);
            poller[0].events = ZMQ_POLLIN;
            sockets[0] = &brokerConnection;
        }
    }
}